

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

void Abc_NtkDetectClassesTest2(Abc_Ntk_t *pNtk,int fVerbose,int fVeryVerbose)

{
  Vec_Wec_t *p;
  int iVar1;
  uint Entry;
  Abc_Obj_t *pObj_00;
  int local_3c;
  int i;
  Abc_Obj_t *pObj;
  Vec_Wec_t *vCos;
  Vec_Wec_t *vRes;
  Vec_Int_t *vObjs;
  int fVeryVerbose_local;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  vObjs._0_4_ = fVeryVerbose;
  vObjs._4_4_ = fVerbose;
  _fVeryVerbose_local = pNtk;
  iVar1 = Abc_NtkCiNum(pNtk);
  vRes = (Vec_Wec_t *)Vec_IntAlloc(iVar1);
  for (local_3c = 0; iVar1 = Abc_NtkCiNum(_fVeryVerbose_local), local_3c < iVar1;
      local_3c = local_3c + 1) {
    pObj_00 = Abc_NtkCi(_fVeryVerbose_local,local_3c);
    p = vRes;
    Entry = Abc_ObjId(pObj_00);
    Vec_IntPush((Vec_Int_t *)p,Entry);
  }
  vCos = Abc_NtkDetectObjClasses(_fVeryVerbose_local,(Vec_Int_t *)vRes,(Vec_Wec_t **)&pObj);
  Vec_WecPrint(vCos,0);
  Vec_WecPrint((Vec_Wec_t *)pObj,0);
  Vec_IntFree((Vec_Int_t *)vRes);
  Vec_WecFree(vCos);
  Vec_WecFree((Vec_Wec_t *)pObj);
  return;
}

Assistant:

void Abc_NtkDetectClassesTest2( Abc_Ntk_t * pNtk, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vObjs;
    Vec_Wec_t * vRes, * vCos;
    // for testing, create the set of object IDs for all combinational inputs (CIs)
    Abc_Obj_t * pObj; int i;
    vObjs = Vec_IntAlloc( Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Vec_IntPush( vObjs, Abc_ObjId(pObj) );
    // compute equivalence classes of CIs and print them
    vRes = Abc_NtkDetectObjClasses( pNtk, vObjs, &vCos );
    Vec_WecPrint( vRes, 0 );
    Vec_WecPrint( vCos, 0 );
    // clean up
    Vec_IntFree( vObjs );
    Vec_WecFree( vRes );
    Vec_WecFree( vCos );
}